

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::IteratorSymbol>
          (ASTSerializer *this,IteratorSymbol *elem,bool inMembersArray)

{
  bool bVar1;
  SourceManager *pSVar2;
  size_t sVar3;
  Type *__n;
  Expression *this_00;
  IteratorSymbol *in_RSI;
  ASTSerializer *in_RDI;
  string_view sVar4;
  Expression *init;
  AttributeSymbol *attr;
  iterator __end0;
  iterator __begin0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range6;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  SourceManager *sm;
  int __fd;
  Compilation *in_stack_fffffffffffffed0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffed8;
  ASTSerializer *in_stack_fffffffffffffee0;
  int __fd_00;
  size_t in_stack_fffffffffffffee8;
  JsonWriter *in_stack_fffffffffffffef0;
  iterator in_stack_ffffffffffffff00;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_f8;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_f0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_d8;
  int local_c8;
  SourceManager *in_stack_ffffffffffffff40;
  int local_b0;
  SourceManager *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  void *local_90;
  size_t local_80;
  int local_70;
  void *local_68;
  size_t local_58;
  int local_48;
  void *local_40;
  int local_28;
  void *local_20;
  
  if ((in_RSI->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.kind !=
      TransparentMember) {
    JsonWriter::startObject(in_stack_fffffffffffffef0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
               (char *)in_stack_fffffffffffffed8);
    write(in_RDI,local_28,local_20,
          (in_RSI->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.name.
          _M_len);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
               (char *)in_stack_fffffffffffffed8);
    sVar4 = ast::toString(Unknown);
    local_58 = sVar4._M_len;
    write(in_RDI,local_48,local_40,local_58);
    if (((in_RDI->includeSourceInfo & 1U) != 0) &&
       (pSVar2 = Compilation::getSourceManager(in_RDI->compilation), pSVar2 != (SourceManager *)0x0)
       ) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      sVar4 = SourceManager::getFileName(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
      local_80 = sVar4._M_len;
      write(in_RDI,local_70,local_68,local_80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      sVar3 = SourceManager::getLineNumber
                        ((SourceManager *)
                         (in_RSI->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                         super_Symbol.location,in_stack_ffffffffffffff68);
      write(in_RDI,in_stack_ffffffffffffff68._0_4_,local_90,sVar3);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      sVar3 = SourceManager::getColumnNumber
                        (in_stack_ffffffffffffff40,
                         (in_RSI->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                         super_Symbol.location);
      write(in_RDI,local_b0,in_stack_ffffffffffffff58,sVar3);
    }
    if ((in_RDI->includeAddrs & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      write(in_RDI,local_c8,in_stack_ffffffffffffff40,(size_t)in_RSI);
    }
    local_d8 = Compilation::getAttributes(in_stack_fffffffffffffed0,(Symbol *)in_RDI);
    bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                      ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                       0x4b6a9f);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      sVar4._M_str = (char *)in_stack_fffffffffffffef0;
      sVar4._M_len = in_stack_fffffffffffffee8;
      startArray(in_stack_fffffffffffffee0,sVar4);
      local_f0 = &local_d8;
      local_f8._M_current =
           (AttributeSymbol **)
           std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                      in_RDI);
      in_stack_ffffffffffffff00 =
           std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
                     (in_stack_fffffffffffffed8);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffed0,
                                (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                                 *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
        ::operator*(&local_f8);
        serialize((ASTSerializer *)in_stack_fffffffffffffed0,(Symbol *)in_RDI,false);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_f8);
      }
      endArray((ASTSerializer *)0x4b6b41);
    }
    __fd = (int)in_stack_fffffffffffffed0;
    __fd_00 = (int)in_stack_fffffffffffffee8;
    if ((in_RSI->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.kind !=
        EnumValue) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
                 (char *)in_stack_fffffffffffffed8);
      __n = ValueSymbol::getType((ValueSymbol *)0x4b6b6c);
      write(in_RDI,__fd_00,in_stack_fffffffffffffef0,(size_t)__n);
    }
    this_00 = ValueSymbol::getInitializer((ValueSymbol *)0x4b6b8f);
    if (this_00 != (Expression *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
                 (char *)in_stack_fffffffffffffed8);
      write(in_RDI,__fd,in_stack_fffffffffffffed8,(size_t)this_00);
    }
    IteratorSymbol::serializeTo(in_RSI,in_RDI);
    JsonWriter::endObject((JsonWriter *)in_stack_ffffffffffffff00._M_current);
  }
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}